

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall MeterPrivate::MeterPrivate(MeterPrivate *this,Meter *parent)

{
  Meter *parent_local;
  MeterPrivate *this_local;
  
  this->drawValue = true;
  this->drawGridValues = true;
  this->valuePrecision = 0;
  this->scalePrecision = 0;
  this->currentThreshold = 0;
  this->radius = 100;
  this->startScaleAngle = 0x1e;
  this->stopScaleAngle = 0x14a;
  this->minValue = 0.0;
  this->maxValue = 100.0;
  this->value = 0.0;
  this->scaleStep = 1.0;
  this->scaleGridStep = 10.0;
  QColor::QColor(&this->backgroundColor,black);
  QColor::QColor(&this->needleColor,blue);
  QColor::QColor(&this->textColor,white);
  QColor::QColor(&this->gridColor,white);
  QString::QString(&this->label);
  QString::QString(&this->unitsLabel);
  QMultiMap<int,_MeterPrivate::RangeData>::QMultiMap(&this->ranges);
  this->q = parent;
  return;
}

Assistant:

explicit MeterPrivate( Meter * parent )
		:  drawValue( true )
		,  drawGridValues( true )
		,  valuePrecision( 0 )
		,  scalePrecision( 0 )
		,  currentThreshold( 0 )
		,  radius( 100 )
		,  startScaleAngle( 30 )
		,  stopScaleAngle( 330 )
		,  minValue( 0.0 )
		,  maxValue( 100.0 )
		,  value( 0.0 )
		,  scaleStep( 1.0 )
		,  scaleGridStep( 10.0 )
		,  backgroundColor( Qt::black )
		,  needleColor( Qt::blue )
		,  textColor( Qt::white )
		,  gridColor( Qt::white )
		,  q( parent )
	{
	}